

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Div::innerExtrema
          (Interval *__return_storage_ptr__,Div *this,EvalContext *param_1,Interval *nom,
          Interval *den)

{
  Interval *pIVar1;
  bool bVar2;
  float fVar3;
  double dVar4;
  Interval local_88;
  Interval local_70;
  Interval local_58;
  Interval local_40;
  Interval *local_28;
  Interval *den_local;
  Interval *nom_local;
  EvalContext *param_1_local;
  Div *this_local;
  
  local_28 = den;
  den_local = nom;
  nom_local = (Interval *)param_1;
  param_1_local = (EvalContext *)this;
  tcu::Interval::Interval(__return_storage_ptr__);
  pIVar1 = local_28;
  tcu::Interval::Interval(&local_40,0.0);
  bVar2 = tcu::Interval::contains(pIVar1,&local_40);
  pIVar1 = den_local;
  if (bVar2) {
    tcu::Interval::Interval(&local_58,0.0);
    bVar2 = tcu::Interval::contains(pIVar1,&local_58);
    if (bVar2) {
      fVar3 = std::numeric_limits<float>::quiet_NaN();
      tcu::Interval::Interval(&local_70,(double)fVar3);
      tcu::Interval::operator|=(__return_storage_ptr__,&local_70);
    }
    dVar4 = tcu::Interval::lo(den_local);
    if ((dVar4 < 0.0) || (dVar4 = tcu::Interval::hi(den_local), 0.0 < dVar4)) {
      tcu::Interval::unbounded(&local_88,false);
      tcu::Interval::operator|=(__return_storage_ptr__,&local_88);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	innerExtrema	(const EvalContext&,
								 const Interval&		nom,
								 const Interval&		den) const
	{
		Interval ret;

		if (den.contains(0.0))
		{
			if (nom.contains(0.0))
				ret |= TCU_NAN;

			if (nom.lo() < 0.0 || nom.hi() > 0.0)
				ret |= Interval::unbounded();
		}

		return ret;
	}